

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void * POOL_thread(void *opaque)

{
  code *pcVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  void *in_RDI;
  bool bVar4;
  POOL_job job;
  POOL_ctx *ctx;
  
  if (in_RDI == (void *)0x0) {
    return (void *)0x0;
  }
  do {
    pthread_mutex_lock((pthread_mutex_t *)((long)in_RDI + 0x60));
    while( true ) {
      bVar4 = true;
      if (*(int *)((long)in_RDI + 0x58) == 0) {
        bVar4 = *(ulong *)((long)in_RDI + 0x28) <= *(ulong *)((long)in_RDI + 0x50);
      }
      if (!bVar4) break;
      if (*(int *)((long)in_RDI + 0xe8) != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)((long)in_RDI + 0x60));
        return in_RDI;
      }
      pthread_cond_wait((pthread_cond_t *)((long)in_RDI + 0xb8),
                        (pthread_mutex_t *)((long)in_RDI + 0x60));
    }
    puVar3 = (undefined8 *)(*(long *)((long)in_RDI + 0x30) + *(long *)((long)in_RDI + 0x38) * 0x10);
    pcVar1 = (code *)*puVar3;
    uVar2 = puVar3[1];
    *(ulong *)((long)in_RDI + 0x38) =
         (*(long *)((long)in_RDI + 0x38) + 1U) % *(ulong *)((long)in_RDI + 0x48);
    *(long *)((long)in_RDI + 0x50) = *(long *)((long)in_RDI + 0x50) + 1;
    *(uint *)((long)in_RDI + 0x58) =
         (uint)(*(long *)((long)in_RDI + 0x38) == *(long *)((long)in_RDI + 0x40));
    pthread_cond_signal((pthread_cond_t *)((long)in_RDI + 0x88));
    pthread_mutex_unlock((pthread_mutex_t *)((long)in_RDI + 0x60));
    (*pcVar1)(uVar2);
    pthread_mutex_lock((pthread_mutex_t *)((long)in_RDI + 0x60));
    *(long *)((long)in_RDI + 0x50) = *(long *)((long)in_RDI + 0x50) + -1;
    pthread_cond_signal((pthread_cond_t *)((long)in_RDI + 0x88));
    pthread_mutex_unlock((pthread_mutex_t *)((long)in_RDI + 0x60));
  } while( true );
}

Assistant:

static void* POOL_thread(void* opaque) {
    POOL_ctx* const ctx = (POOL_ctx*)opaque;
    if (!ctx) { return NULL; }
    for (;;) {
        /* Lock the mutex and wait for a non-empty queue or until shutdown */
        ZSTD_pthread_mutex_lock(&ctx->queueMutex);

        while ( ctx->queueEmpty
            || (ctx->numThreadsBusy >= ctx->threadLimit) ) {
            if (ctx->shutdown) {
                /* even if !queueEmpty, (possible if numThreadsBusy >= threadLimit),
                 * a few threads will be shutdown while !queueEmpty,
                 * but enough threads will remain active to finish the queue */
                ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
                return opaque;
            }
            ZSTD_pthread_cond_wait(&ctx->queuePopCond, &ctx->queueMutex);
        }
        /* Pop a job off the queue */
        {   POOL_job const job = ctx->queue[ctx->queueHead];
            ctx->queueHead = (ctx->queueHead + 1) % ctx->queueSize;
            ctx->numThreadsBusy++;
            ctx->queueEmpty = (ctx->queueHead == ctx->queueTail);
            /* Unlock the mutex, signal a pusher, and run the job */
            ZSTD_pthread_cond_signal(&ctx->queuePushCond);
            ZSTD_pthread_mutex_unlock(&ctx->queueMutex);

            job.function(job.opaque);

            /* If the intended queue size was 0, signal after finishing job */
            ZSTD_pthread_mutex_lock(&ctx->queueMutex);
            ctx->numThreadsBusy--;
            ZSTD_pthread_cond_signal(&ctx->queuePushCond);
            ZSTD_pthread_mutex_unlock(&ctx->queueMutex);
        }
    }  /* for (;;) */
    assert(0);  /* Unreachable */
}